

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O1

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::sort_cells(rasterizer_cells_aa<agg::cell_aa> *this)

{
  pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y> *this_00;
  sorted_y *psVar1;
  int iVar2;
  sorted_y *psVar3;
  int iVar4;
  int iVar5;
  cell_type **ppcVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  cell_type **ppcVar10;
  cell_type *pcVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  uint uVar15;
  
  if (this->m_sorted != false) {
    return;
  }
  if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
    if ((this->m_num_cells & 0xfff) == 0) {
      if (0x3ff < this->m_num_blocks) goto LAB_001111c7;
      allocate_block(this);
    }
    pcVar11 = this->m_curr_cell_ptr;
    this->m_curr_cell_ptr = pcVar11 + 1;
    iVar2 = (this->m_curr_cell).y;
    iVar4 = (this->m_curr_cell).cover;
    iVar5 = (this->m_curr_cell).area;
    pcVar11->x = (this->m_curr_cell).x;
    pcVar11->y = iVar2;
    pcVar11->cover = iVar4;
    pcVar11->area = iVar5;
    this->m_num_cells = this->m_num_cells + 1;
  }
LAB_001111c7:
  (this->m_curr_cell).x = 0x7fffffff;
  (this->m_curr_cell).y = 0x7fffffff;
  (this->m_curr_cell).cover = 0;
  (this->m_curr_cell).area = 0;
  uVar15 = this->m_num_cells;
  if (uVar15 != 0) {
    pod_vector<agg::cell_aa_*>::capacity(&this->m_sorted_cells,uVar15,0x10);
    (this->m_sorted_cells).m_size = uVar15;
    this_00 = &this->m_sorted_y;
    uVar15 = (this->m_max_y - this->m_min_y) + 1;
    pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::capacity(this_00,uVar15,0x10);
    (this->m_sorted_y).m_size = uVar15;
    memset((this->m_sorted_y).m_array,0,(ulong)uVar15 << 3);
    ppcVar6 = this->m_cells;
    uVar15 = this->m_num_cells;
    if (uVar15 != 0) {
      iVar2 = this->m_min_y;
      psVar3 = (this->m_sorted_y).m_array;
      ppcVar10 = ppcVar6;
      uVar12 = uVar15;
      do {
        uVar9 = 0x1000;
        if (uVar12 < 0x1000) {
          uVar9 = uVar12;
        }
        piVar14 = &(*ppcVar10)->y;
        uVar7 = uVar9;
        do {
          psVar1 = psVar3 + (uint)(*piVar14 - iVar2);
          psVar1->start = psVar1->start + 1;
          piVar14 = piVar14 + 4;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        ppcVar10 = ppcVar10 + 1;
        uVar12 = uVar12 - uVar9;
      } while (uVar12 != 0);
    }
    uVar12 = this_00->m_size;
    if ((ulong)uVar12 != 0) {
      psVar3 = (this->m_sorted_y).m_array;
      uVar8 = 0;
      uVar9 = 0;
      do {
        uVar7 = psVar3[uVar8].start;
        psVar3[uVar8].start = uVar9;
        uVar8 = uVar8 + 1;
        uVar9 = uVar7 + uVar9;
      } while (uVar12 != uVar8);
    }
    if (uVar15 != 0) {
      iVar2 = this->m_min_y;
      do {
        pcVar11 = *ppcVar6;
        uVar12 = 0x1000;
        uVar9 = 0x1000;
        if (uVar15 < 0x1000) {
          uVar12 = uVar15;
          uVar9 = uVar15;
        }
        do {
          uVar13 = pcVar11->y - iVar2;
          psVar3 = (this->m_sorted_y).m_array;
          uVar7 = psVar3[uVar13].num;
          (this->m_sorted_cells).m_array[psVar3[uVar13].start + uVar7] = pcVar11;
          pcVar11 = pcVar11 + 1;
          psVar3[uVar13].num = uVar7 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        ppcVar6 = ppcVar6 + 1;
        uVar15 = uVar15 - uVar9;
      } while (uVar15 != 0);
    }
    if (this_00->m_size != 0) {
      uVar8 = 0;
      do {
        psVar3 = (this->m_sorted_y).m_array;
        uVar15 = psVar3[uVar8].num;
        if (uVar15 != 0) {
          qsort_cells<agg::cell_aa>((this->m_sorted_cells).m_array + psVar3[uVar8].start,uVar15);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < this_00->m_size);
    }
    this->m_sorted = true;
  }
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::sort_cells()
    {
        if(m_sorted) return; //Perform sort only the first time.

        add_curr_cell();
        m_curr_cell.x     = std::numeric_limits<int>::max();
        m_curr_cell.y     = std::numeric_limits<int>::max();
        m_curr_cell.cover = 0;
        m_curr_cell.area  = 0;

        if(m_num_cells == 0) return;

// DBG: Check to see if min/max works well.
//for(unsigned nc = 0; nc < m_num_cells; nc++)
//{
//    cell_type* cell = m_cells[nc >> cell_block_shift] + (nc & cell_block_mask);
//    if(cell->x < m_min_x || 
//       cell->y < m_min_y || 
//       cell->x > m_max_x || 
//       cell->y > m_max_y)
//    {
//        cell = cell; // Breakpoint here
//    }
//}
        // Allocate the array of cell pointers
        m_sorted_cells.allocate(m_num_cells, 16);

        // Allocate and zero the Y array
        m_sorted_y.allocate(m_max_y - m_min_y + 1, 16);
        m_sorted_y.zero();

        // Create the Y-histogram (count the numbers of cells for each Y)
        cell_type** block_ptr = m_cells;
        cell_type*  cell_ptr;
        unsigned nb = m_num_cells;
        unsigned i;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--) 
            {
                m_sorted_y[cell_ptr->y - m_min_y].start++;
                ++cell_ptr;
            }
        }

        // Convert the Y-histogram into the array of starting indexes
        unsigned start = 0;
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            unsigned v = m_sorted_y[i].start;
            m_sorted_y[i].start = start;
            start += v;
        }

        // Fill the cell pointer array sorted by Y
        block_ptr = m_cells;
        nb = m_num_cells;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--)
            {
                sorted_y& curr_y = m_sorted_y[cell_ptr->y - m_min_y];
                m_sorted_cells[curr_y.start + curr_y.num] = cell_ptr;
                ++curr_y.num;
                ++cell_ptr;
            }
        }
        
        // Finally arrange the X-arrays
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            const sorted_y& curr_y = m_sorted_y[i];
            if(curr_y.num)
            {
                qsort_cells(m_sorted_cells.data() + curr_y.start, curr_y.num);
            }
        }
        m_sorted = true;
    }